

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O3

int unzReadCurrentFile(unzFile file,voidp buf,uint len)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar6 = -0x66;
  if ((file != (unzFile)0x0) && (plVar1 = *(long **)((long)file + 0x140), plVar1 != (long *)0x0)) {
    if (*plVar1 == 0) {
      iVar6 = -100;
    }
    else {
      iVar6 = 0;
      if (len != 0) {
        plVar1[4] = (long)buf;
        *(uint *)(plVar1 + 5) = len;
        uVar8 = (ulong)len;
        if (((ulong)plVar1[0x18] < uVar8) && ((int)plVar1[0x27] == 0)) {
          len = (uint)plVar1[0x18];
          *(uint *)(plVar1 + 5) = len;
        }
        if ((plVar1[0x17] + (ulong)*(uint *)(plVar1 + 2) < uVar8) && ((int)plVar1[0x27] != 0)) {
          len = (int)plVar1[0x17] + *(uint *)(plVar1 + 2);
          *(uint *)(plVar1 + 5) = len;
        }
        if (len != 0) {
          iVar6 = 0;
          do {
            uVar8 = (ulong)*(uint *)(plVar1 + 2);
            if (*(uint *)(plVar1 + 2) == 0) {
              uVar8 = plVar1[0x17];
              if (uVar8 == 0) {
                uVar8 = 0;
              }
              else {
                if (0x3fff < uVar8) {
                  uVar8 = 0x4000;
                }
                lVar4 = call_zseek64((zlib_filefunc64_32_def *)(plVar1 + 0x19),(voidpf)plVar1[0x24],
                                     plVar1[0x26] + plVar1[0xf],0);
                if (lVar4 != 0) {
                  return -1;
                }
                uVar5 = (*(code *)plVar1[0x1a])(plVar1[0x20],plVar1[0x24],*plVar1);
                if (uVar5 != uVar8) {
                  return -1;
                }
                plVar1[0xf] = plVar1[0xf] + uVar8;
                plVar1[0x17] = plVar1[0x17] - uVar8;
                plVar1[1] = *plVar1;
                *(int *)(plVar1 + 2) = (int)uVar8;
              }
            }
            if ((plVar1[0x25] == 0) || ((int)plVar1[0x27] != 0)) {
              uVar7 = (uint)uVar8;
              if ((uVar7 == 0) && (plVar1[0x17] == 0)) {
                return iVar6;
              }
              if (*(uint *)(plVar1 + 5) < uVar7) {
                uVar7 = *(uint *)(plVar1 + 5);
              }
              if (uVar7 == 0) {
                uVar8 = 0;
              }
              else {
                uVar8 = (ulong)uVar7;
                uVar5 = 0;
                do {
                  *(undefined1 *)(plVar1[4] + uVar5) = *(undefined1 *)(plVar1[1] + uVar5);
                  uVar5 = uVar5 + 1;
                } while (uVar8 != uVar5);
              }
              plVar1[0x14] = plVar1[0x14] + uVar8;
              lVar4 = crc32(plVar1[0x15],plVar1[4],uVar7);
              plVar1[0x15] = lVar4;
              plVar1[0x18] = plVar1[0x18] - uVar8;
              *(uint *)(plVar1 + 2) = (int)plVar1[2] - uVar7;
              *(uint *)(plVar1 + 5) = (int)plVar1[5] - uVar7;
              plVar1[4] = plVar1[4] + uVar8;
              plVar1[1] = plVar1[1] + uVar8;
              plVar1[6] = plVar1[6] + uVar8;
              iVar6 = iVar6 + uVar7;
            }
            else if (plVar1[0x25] != 0xc) {
              lVar4 = plVar1[4];
              lVar2 = plVar1[6];
              iVar3 = inflate(plVar1 + 1,2);
              if ((-1 < iVar3) && (plVar1[7] != 0)) {
                iVar3 = -3;
              }
              uVar8 = plVar1[6] - lVar2;
              plVar1[0x14] = plVar1[0x14] + uVar8;
              lVar4 = crc32(plVar1[0x15],lVar4,uVar8 & 0xffffffff);
              plVar1[0x15] = lVar4;
              plVar1[0x18] = plVar1[0x18] - uVar8;
              iVar6 = iVar6 + (int)uVar8;
              if (iVar3 != 0) {
                if (iVar3 == 1) {
                  return iVar6;
                }
                return iVar3;
              }
            }
          } while ((int)plVar1[5] != 0);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

extern int ZEXPORT unzReadCurrentFile(unzFile file, voidp buf, unsigned len)
{
    int err = UNZ_OK;
    uInt iRead = 0;
    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;


    if (pfile_in_zip_read_info->read_buffer == NULL)
        return UNZ_END_OF_LIST_OF_FILE;
    if (len == 0)
        return 0;

    pfile_in_zip_read_info->stream.next_out = (Bytef*)buf;

    pfile_in_zip_read_info->stream.avail_out = (uInt)len;

    if ((len > pfile_in_zip_read_info->rest_read_uncompressed) &&
        (!(pfile_in_zip_read_info->raw)))
        pfile_in_zip_read_info->stream.avail_out =
        (uInt)pfile_in_zip_read_info->rest_read_uncompressed;

    if ((len > pfile_in_zip_read_info->rest_read_compressed +
        pfile_in_zip_read_info->stream.avail_in) &&
        (pfile_in_zip_read_info->raw))
        pfile_in_zip_read_info->stream.avail_out =
        (uInt)pfile_in_zip_read_info->rest_read_compressed +
        pfile_in_zip_read_info->stream.avail_in;

    while (pfile_in_zip_read_info->stream.avail_out > 0)
    {
        if ((pfile_in_zip_read_info->stream.avail_in == 0) &&
            (pfile_in_zip_read_info->rest_read_compressed > 0))
        {
            uInt uReadThis = UNZ_BUFSIZE;
            if (pfile_in_zip_read_info->rest_read_compressed < uReadThis)
                uReadThis = (uInt)pfile_in_zip_read_info->rest_read_compressed;
            if (uReadThis == 0)
                return UNZ_EOF;
            if (ZSEEK64(pfile_in_zip_read_info->z_filefunc,
                pfile_in_zip_read_info->filestream,
                pfile_in_zip_read_info->pos_in_zipfile +
                pfile_in_zip_read_info->byte_before_the_zipfile,
                ZLIB_FILEFUNC_SEEK_SET) != 0)
                return UNZ_ERRNO;
            if (ZREAD64(pfile_in_zip_read_info->z_filefunc,
                pfile_in_zip_read_info->filestream,
                pfile_in_zip_read_info->read_buffer,
                uReadThis) != uReadThis)
                return UNZ_ERRNO;


#            ifndef NOUNCRYPT
            if (s->encrypted)
            {
                uInt i;
                for (i = 0; i < uReadThis; i++)
                    pfile_in_zip_read_info->read_buffer[i] =
                    zdecode(s->keys, s->pcrc_32_tab,
                        pfile_in_zip_read_info->read_buffer[i]);
            }
#            endif


            pfile_in_zip_read_info->pos_in_zipfile += uReadThis;

            pfile_in_zip_read_info->rest_read_compressed -= uReadThis;

            pfile_in_zip_read_info->stream.next_in =
                (Bytef*)pfile_in_zip_read_info->read_buffer;
            pfile_in_zip_read_info->stream.avail_in = (uInt)uReadThis;
        }

        if ((pfile_in_zip_read_info->compression_method == 0) || (pfile_in_zip_read_info->raw))
        {
            uInt uDoCopy, i;

            if ((pfile_in_zip_read_info->stream.avail_in == 0) &&
                (pfile_in_zip_read_info->rest_read_compressed == 0))
                return (iRead == 0) ? UNZ_EOF : iRead;

            if (pfile_in_zip_read_info->stream.avail_out <
                pfile_in_zip_read_info->stream.avail_in)
                uDoCopy = pfile_in_zip_read_info->stream.avail_out;
            else
                uDoCopy = pfile_in_zip_read_info->stream.avail_in;

            for (i = 0; i < uDoCopy; i++)
                *(pfile_in_zip_read_info->stream.next_out + i) =
                *(pfile_in_zip_read_info->stream.next_in + i);

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uDoCopy;

            pfile_in_zip_read_info->crc32 = crc32(pfile_in_zip_read_info->crc32,
                pfile_in_zip_read_info->stream.next_out,
                uDoCopy);
            pfile_in_zip_read_info->rest_read_uncompressed -= uDoCopy;
            pfile_in_zip_read_info->stream.avail_in -= uDoCopy;
            pfile_in_zip_read_info->stream.avail_out -= uDoCopy;
            pfile_in_zip_read_info->stream.next_out += uDoCopy;
            pfile_in_zip_read_info->stream.next_in += uDoCopy;
            pfile_in_zip_read_info->stream.total_out += uDoCopy;
            iRead += uDoCopy;
        }
        else if (pfile_in_zip_read_info->compression_method == Z_BZIP2ED)
        {
#ifdef HAVE_BZIP2
            uLong uTotalOutBefore, uTotalOutAfter;
            const Bytef* bufBefore;
            uLong uOutThis;

            pfile_in_zip_read_info->bstream.next_in = (char*)pfile_in_zip_read_info->stream.next_in;
            pfile_in_zip_read_info->bstream.avail_in = pfile_in_zip_read_info->stream.avail_in;
            pfile_in_zip_read_info->bstream.total_in_lo32 = pfile_in_zip_read_info->stream.total_in;
            pfile_in_zip_read_info->bstream.total_in_hi32 = 0;
            pfile_in_zip_read_info->bstream.next_out = (char*)pfile_in_zip_read_info->stream.next_out;
            pfile_in_zip_read_info->bstream.avail_out = pfile_in_zip_read_info->stream.avail_out;
            pfile_in_zip_read_info->bstream.total_out_lo32 = pfile_in_zip_read_info->stream.total_out;
            pfile_in_zip_read_info->bstream.total_out_hi32 = 0;

            uTotalOutBefore = pfile_in_zip_read_info->bstream.total_out_lo32;
            bufBefore = (const Bytef*)pfile_in_zip_read_info->bstream.next_out;

            err = BZ2_bzDecompress(&pfile_in_zip_read_info->bstream);

            uTotalOutAfter = pfile_in_zip_read_info->bstream.total_out_lo32;
            uOutThis = uTotalOutAfter - uTotalOutBefore;

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uOutThis;

            pfile_in_zip_read_info->crc32 = crc32(pfile_in_zip_read_info->crc32, bufBefore, (uInt)(uOutThis));
            pfile_in_zip_read_info->rest_read_uncompressed -= uOutThis;
            iRead += (uInt)(uTotalOutAfter - uTotalOutBefore);

            pfile_in_zip_read_info->stream.next_in = (Bytef*)pfile_in_zip_read_info->bstream.next_in;
            pfile_in_zip_read_info->stream.avail_in = pfile_in_zip_read_info->bstream.avail_in;
            pfile_in_zip_read_info->stream.total_in = pfile_in_zip_read_info->bstream.total_in_lo32;
            pfile_in_zip_read_info->stream.next_out = (Bytef*)pfile_in_zip_read_info->bstream.next_out;
            pfile_in_zip_read_info->stream.avail_out = pfile_in_zip_read_info->bstream.avail_out;
            pfile_in_zip_read_info->stream.total_out = pfile_in_zip_read_info->bstream.total_out_lo32;

            if (err == BZ_STREAM_END)
                return (iRead == 0) ? UNZ_EOF : iRead;
            if (err != BZ_OK)
                break;
#endif
        } // end Z_BZIP2ED
        else
        {
            ZPOS64_T uTotalOutBefore, uTotalOutAfter;
            const Bytef* bufBefore;
            ZPOS64_T uOutThis;
            int flush = Z_SYNC_FLUSH;

            uTotalOutBefore = pfile_in_zip_read_info->stream.total_out;
            bufBefore = pfile_in_zip_read_info->stream.next_out;

            /*
            if ((pfile_in_zip_read_info->rest_read_uncompressed ==
                     pfile_in_zip_read_info->stream.avail_out) &&
                (pfile_in_zip_read_info->rest_read_compressed == 0))
                flush = Z_FINISH;
            */
            err = inflate(&pfile_in_zip_read_info->stream, flush);

            if ((err >= 0) && (pfile_in_zip_read_info->stream.msg != NULL))
                err = Z_DATA_ERROR;

            uTotalOutAfter = pfile_in_zip_read_info->stream.total_out;
            uOutThis = uTotalOutAfter - uTotalOutBefore;

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uOutThis;

            pfile_in_zip_read_info->crc32 =
                crc32(pfile_in_zip_read_info->crc32, bufBefore,
                (uInt)(uOutThis));

            pfile_in_zip_read_info->rest_read_uncompressed -=
                uOutThis;

            iRead += (uInt)(uTotalOutAfter - uTotalOutBefore);

            if (err == Z_STREAM_END)
                return (iRead == 0) ? UNZ_EOF : iRead;
            if (err != Z_OK)
                break;
        }
    }

    if (err == Z_OK)
        return iRead;
    return err;
}